

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

bool slang::ast::Lookup::ensureAccessible
               (Symbol *symbol,ASTContext *context,optional<slang::SourceRange> sourceRange)

{
  Type *rhs;
  Type *this;
  ClassType *this_00;
  bool bVar1;
  ClassType *rhs_00;
  Diagnostic *pDVar2;
  Symbol *symbol_00;
  Scope *pSVar3;
  pair<const_slang::ast::ClassType_*,_bool> pVar4;
  
  if ((context->randomizeDetails != (RandomizeDetails *)0x0) &&
     (pSVar3 = context->randomizeDetails->classType, pSVar3 != (Scope *)0x0)) {
    rhs = (Type *)pSVar3->thisSym;
    this = (Type *)symbol->parentScope->thisSym;
    if (this == rhs) {
      return true;
    }
    if (((this->super_Symbol).kind == ClassType) &&
       (bVar1 = Type::isAssignmentCompatible(this,rhs), bVar1)) {
      return true;
    }
  }
  pSVar3 = (context->scope).ptr;
  pVar4 = getContainingClass(pSVar3);
  rhs_00 = pVar4.first;
  if (rhs_00 != (ClassType *)0x0) {
    symbol_00 = (Symbol *)symbol->parentScope;
    this_00 = (ClassType *)(symbol_00->name)._M_len;
    if (this_00 != rhs_00) {
      if ((this_00->super_Type).super_Symbol.kind == ClassType) {
        bVar1 = Type::isAssignmentCompatible((Type *)this_00,&rhs_00->super_Type);
        if (bVar1) goto LAB_003ac9a2;
        pSVar3 = (context->scope).ptr;
        symbol_00 = (Symbol *)symbol->parentScope;
      }
      bVar1 = anon_unknown_39::withinCovergroup(symbol_00,pSVar3);
      if (!bVar1) {
        if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_engaged != true) {
          return false;
        }
        pDVar2 = ASTContext::addDiag(context,(DiagCode)0x1a000a,
                                     sourceRange.
                                     super__Optional_base<slang::SourceRange,_true,_true>._M_payload
                                     .super__Optional_payload_base<slang::SourceRange>._M_payload.
                                     _M_value);
        pDVar2 = Diagnostic::operator<<(pDVar2,symbol->name);
        goto LAB_003ac9e6;
      }
    }
  }
LAB_003ac9a2:
  if ((((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
     (((context->flags).m_bits & 0x40) == 0)) {
    if (rhs_00 != (ClassType *)0x0) {
      return true;
    }
    bVar1 = anon_unknown_39::withinCovergroup((Symbol *)symbol->parentScope,(context->scope).ptr);
    if (bVar1) {
      return true;
    }
  }
  if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged != true) {
    return false;
  }
  pDVar2 = ASTContext::addDiag(context,(DiagCode)0x1d000a,
                               sourceRange.super__Optional_base<slang::SourceRange,_true,_true>.
                               _M_payload.super__Optional_payload_base<slang::SourceRange>.
                               _M_payload._M_value);
  rhs_00 = (ClassType *)symbol;
LAB_003ac9e6:
  Diagnostic::operator<<(pDVar2,(rhs_00->super_Type).super_Symbol.name);
  return false;
}

Assistant:

bool Lookup::ensureAccessible(const Symbol& symbol, const ASTContext& context,
                              std::optional<SourceRange> sourceRange) {
    if (context.randomizeDetails && context.randomizeDetails->classType &&
        Lookup::isAccessibleFrom(symbol, context.randomizeDetails->classType->asSymbol())) {
        return true;
    }

    auto [parent, inStatic] = getContainingClass(*context.scope);
    if (parent && !isAccessibleFrom(symbol, *parent) && !withinCovergroup(symbol, *context.scope)) {
        if (sourceRange) {
            auto& diag = context.addDiag(diag::NestedNonStaticClassProperty, *sourceRange);
            diag << symbol.name << parent->name;
        }
        return false;
    }
    else if (inStatic || context.flags.has(ASTFlags::StaticInitializer) ||
             (!parent && !withinCovergroup(symbol, *context.scope))) {
        if (sourceRange)
            context.addDiag(diag::NonStaticClassProperty, *sourceRange) << symbol.name;
        return false;
    }
    return true;
}